

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

int Gia_ManAreCubeCollectTree_rec(Gia_ManAre_t *p,Gia_ObjAre_t *pObj,Gia_StaAre_t *pSta)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int unaff_EBP;
  Gia_PtrAre_t GVar7;
  uint *puVar8;
  
  bVar2 = false;
  do {
    uVar6 = *(uint *)pObj;
    uVar1 = *(uint *)(&pSta[1].iPrev.field_0x0 + (uVar6 >> 2 & 0xffc));
    uVar4 = uVar6 * 2 & 0x1e;
    if ((uVar1 >> uVar4 & 1) == 0) {
      if ((uVar1 >> (sbyte)uVar4 & 2) != 0) {
        if (((uVar6 & 0x3f00000) == 0) && (lVar5 = 8, ((uint)pObj->F[1] & 0x7fffffff) != 0))
        goto LAB_006975c9;
        GVar7 = pObj->F[1];
        while (puVar8 = (uint *)((long)p->nSize * (ulong)((uint)GVar7 & 0xfffff) * 4 +
                                *(long *)((long)p->ppStas + (ulong)((uint)GVar7 >> 0x11 & 0x3ff8))),
              *p->ppStas != puVar8) {
          if (-1 < (int)*puVar8) {
            if (0 < (long)p->nWords) {
              lVar5 = 0;
              do {
                uVar6 = puVar8[lVar5 + 2] ^ (uint)(&pSta[1].iPrev)[lVar5];
                if ((uVar6 >> 1 & uVar6 & 0x55555555) != 0) goto LAB_0069759c;
                lVar5 = lVar5 + 1;
              } while (p->nWords != lVar5);
            }
            Vec_IntPush((&p->vCubesA)[p->iStaCur < (int)((uint)GVar7 & 0x7fffffff)],
                        (uint)GVar7 & 0x7fffffff);
          }
LAB_0069759c:
          GVar7 = *(Gia_PtrAre_t *)(puVar8 + 1);
        }
      }
    }
    else if (((uVar6 & 0xfc000) == 0) && (lVar5 = 4, ((uint)pObj->F[0] & 0x7fffffff) != 0)) {
LAB_006975c9:
      uVar6 = *(uint *)(&((Gia_ObjAre_t *)(pObj->F + -1))->field_0x0 + lVar5);
      Gia_ManAreCubeCollectTree_rec
                (p,(Gia_ObjAre_t *)
                   ((ulong)((uVar6 & 0xfffff) << 4) +
                   *(long *)((long)p->ppObjs + (ulong)(uVar6 >> 0x11 & 0x3ff8))),pSta);
    }
    else {
      GVar7 = pObj->F[0];
      while (puVar8 = (uint *)((long)p->nSize * (ulong)((uint)GVar7 & 0xfffff) * 4 +
                              *(long *)((long)p->ppStas + (ulong)((uint)GVar7 >> 0x11 & 0x3ff8))),
            *p->ppStas != puVar8) {
        if (-1 < (int)*puVar8) {
          if (0 < (long)p->nWords) {
            lVar5 = 0;
            do {
              uVar6 = puVar8[lVar5 + 2] ^ (uint)(&pSta[1].iPrev)[lVar5];
              if ((uVar6 >> 1 & uVar6 & 0x55555555) != 0) goto LAB_00697502;
              lVar5 = lVar5 + 1;
            } while (p->nWords != lVar5);
          }
          Vec_IntPush((&p->vCubesA)[p->iStaCur < (int)((uint)GVar7 & 0x7fffffff)],
                      (uint)GVar7 & 0x7fffffff);
        }
LAB_00697502:
        GVar7 = *(Gia_PtrAre_t *)(puVar8 + 1);
      }
    }
    if ((0x3ffffff < *(uint *)pObj) || (((uint)pObj->F[2] & 0x7fffffff) == 0)) {
      GVar7 = pObj->F[2];
      do {
        puVar8 = (uint *)((long)p->nSize * (ulong)((uint)GVar7 & 0xfffff) * 4 +
                         *(long *)((long)p->ppStas + (ulong)((uint)GVar7 >> 0x11 & 0x3ff8)));
        if (*p->ppStas == puVar8) {
          iVar3 = 1;
          if (bVar2) {
            iVar3 = unaff_EBP;
          }
          return iVar3;
        }
        if (-1 < (int)*puVar8) {
          if (0 < (long)p->nWords) {
            lVar5 = 0;
            do {
              uVar6 = puVar8[lVar5 + 2] ^ (uint)(&pSta[1].iPrev)[lVar5];
              if ((uVar6 >> 1 & uVar6 & 0x55555555) != 0) goto LAB_006976b7;
              lVar5 = lVar5 + 1;
            } while (p->nWords != lVar5);
          }
          Vec_IntPush((&p->vCubesA)[p->iStaCur < (int)((uint)GVar7 & 0x7fffffff)],
                      (uint)GVar7 & 0x7fffffff);
        }
LAB_006976b7:
        GVar7 = *(Gia_PtrAre_t *)(puVar8 + 1);
      } while( true );
    }
    pObj = (Gia_ObjAre_t *)
           ((ulong)(((uint)pObj->F[2] & 0xfffff) << 4) +
           *(long *)((long)p->ppObjs + (ulong)((uint)pObj->F[2] >> 0x11 & 0x3ff8)));
    if (!bVar2) {
      unaff_EBP = 1;
    }
    bVar2 = true;
  } while( true );
}

Assistant:

int Gia_ManAreCubeCollectTree_rec( Gia_ManAre_t * p, Gia_ObjAre_t * pObj, Gia_StaAre_t * pSta )
{
    int RetValue;
    if ( Gia_StaHasValue0(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch0(pObj) )
            RetValue = Gia_ManAreCubeCollectTree_rec( p, Gia_ObjNextObj0(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCollectList( p, pObj->F, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    else if ( Gia_StaHasValue1(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch1(pObj) )
            RetValue = Gia_ManAreCubeCollectTree_rec( p, Gia_ObjNextObj1(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCollectList( p, pObj->F + 1, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    if ( Gia_ObjHasBranch2(pObj) )
        return Gia_ManAreCubeCollectTree_rec( p, Gia_ObjNextObj2(p, pObj), pSta );
    return Gia_ManAreCubeCollectList( p, pObj->F + 2, pSta );
}